

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O3

ParserPtr __thiscall libcellml::Parser::create(Parser *this,bool strict)

{
  Parser *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  ParserPtr PVar1;
  
  this_00 = (Parser *)operator_new(0x20);
  Parser(this_00);
  (this->super_Logger)._vptr_Logger = (_func_int **)this_00;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<libcellml::Parser*>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&(this->super_Logger).mPimpl,this_00);
  Strict::setStrict((Strict *)((this->super_Logger)._vptr_Logger + 2),strict);
  PVar1.super___shared_ptr<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  PVar1.super___shared_ptr<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (ParserPtr)PVar1.super___shared_ptr<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ParserPtr Parser::create(bool strict) noexcept
{
    auto parser = std::shared_ptr<Parser> {new Parser {}};
    parser->setStrict(strict);
    return parser;
}